

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diag.cpp
# Opt level: O3

int __thiscall ncnn::Diag::forward(Diag *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  ulong uVar11;
  uint uVar12;
  
  if (bottom_blob->dims == 2) {
    uVar1 = bottom_blob->w;
    uVar4 = bottom_blob->h;
    uVar8 = uVar1 - uVar4;
    uVar12 = (int)uVar8 >> 0x1f & uVar8;
    uVar9 = 0;
    if (0 < (int)uVar8) {
      uVar9 = uVar8;
    }
    iVar3 = this->diagonal;
    if (iVar3 < (int)uVar12 || (int)uVar9 < iVar3) {
      if ((iVar3 == -uVar4 || SBORROW4(iVar3,-uVar4) != (int)(iVar3 + uVar4) < 0) ||
          (int)uVar12 <= iVar3) {
        uVar8 = 0;
        if ((int)uVar9 < iVar3) {
          uVar8 = uVar1 - iVar3;
          if (uVar1 - iVar3 == 0 || (int)uVar1 < iVar3) {
            uVar8 = 0;
          }
        }
      }
      else {
        uVar8 = iVar3 + uVar4;
      }
    }
    else {
      uVar8 = uVar1;
      if ((int)uVar4 < (int)uVar1) {
        uVar8 = uVar4;
      }
    }
    Mat::create(top_blob,uVar8,bottom_blob->elemsize,opt->blob_allocator);
    pvVar10 = top_blob->data;
    if ((pvVar10 == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0)) {
      iVar3 = -100;
      if (uVar8 == 0) {
        iVar3 = 0;
      }
    }
    else if ((int)uVar8 < 1) {
      iVar3 = 0;
    }
    else {
      uVar1 = this->diagonal;
      iVar3 = 0;
      uVar4 = uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      iVar6 = bottom_blob->w;
      pvVar7 = (void *)((ulong)uVar4 * 4 + (long)bottom_blob->data);
      sVar2 = bottom_blob->elemsize;
      iVar5 = -((int)uVar1 >> 0x1f & uVar1);
      uVar11 = 0;
      do {
        *(undefined4 *)((long)pvVar10 + uVar11 * 4) =
             *(undefined4 *)((long)pvVar7 + (long)iVar6 * sVar2 * (long)iVar5);
        uVar11 = uVar11 + 1;
        pvVar7 = (void *)((long)pvVar7 + 4);
        iVar5 = iVar5 + 1;
      } while (uVar8 != uVar11);
    }
  }
  else {
    iVar3 = 0;
    if (bottom_blob->dims == 1) {
      uVar1 = bottom_blob->w;
      iVar3 = this->diagonal;
      iVar6 = -iVar3;
      if (0 < iVar3) {
        iVar6 = iVar3;
      }
      Mat::create(top_blob,iVar6 + uVar1,iVar6 + uVar1,bottom_blob->elemsize,opt->blob_allocator);
      pvVar10 = top_blob->data;
      iVar3 = -100;
      if (pvVar10 != (void *)0x0) {
        if (top_blob->cstep * (long)top_blob->c != 0) {
          uVar4 = (int)top_blob->cstep * top_blob->c;
          if (0 < (int)uVar4) {
            memset(pvVar10,0,(ulong)uVar4 << 2);
          }
          iVar3 = 0;
          if (0 < (int)uVar1) {
            uVar4 = this->diagonal;
            iVar3 = 0;
            uVar9 = uVar4;
            if ((int)uVar4 < 1) {
              uVar9 = 0;
            }
            pvVar7 = bottom_blob->data;
            iVar6 = top_blob->w;
            pvVar10 = (void *)((long)pvVar10 + (ulong)uVar9 * 4);
            sVar2 = top_blob->elemsize;
            iVar5 = -((int)uVar4 >> 0x1f & uVar4);
            uVar11 = 0;
            do {
              *(undefined4 *)((long)pvVar10 + (long)iVar6 * sVar2 * (long)iVar5) =
                   *(undefined4 *)((long)pvVar7 + uVar11 * 4);
              uVar11 = uVar11 + 1;
              pvVar10 = (void *)((long)pvVar10 + 4);
              iVar5 = iVar5 + 1;
            } while (uVar1 != uVar11);
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int Diag::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 1)
    {
        int w = bottom_blob.w;
        int top_w = w + ((diagonal >= 0) ? diagonal : -diagonal);

        top_blob.create(top_w, top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.fill(0.0f);

        int bias_r = -std::min(diagonal, 0);
        int bias_c = std::max(diagonal, 0);

        for (int i = 0; i < w; i++)
        {
            top_blob.row(i + bias_r)[i + bias_c] = bottom_blob[i];
        }
    }
    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int len = 0;
        int minimum = std::min(w - h, 0);
        int maximum = std::max(w - h, 0);
        if (diagonal <= maximum && diagonal >= minimum)
            len = std::min(w, h);
        else if (diagonal > -h && diagonal < minimum)
            len = diagonal + h;
        else if (diagonal > maximum && diagonal < w)
            len = -diagonal + w;

        top_blob.create(len, elemsize, opt.blob_allocator);
        if (top_blob.empty())
        {
            if (len == 0)
                return 0;
            return -100;
        }

        int bias_r = -std::min(diagonal, 0);
        int bias_c = std::max(diagonal, 0);

        for (int i = 0; i < len; i++)
        {
            top_blob[i] = bottom_blob.row(i + bias_r)[i + bias_c];
        }
    }

    return 0;
}